

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape_on_grid.h
# Opt level: O2

void __thiscall
Gudhi::Persistence_representations::Persistence_landscape_on_grid::Persistence_landscape_on_grid
          (Persistence_landscape_on_grid *this,char *filename,size_t number_of_points_,
          uint16_t dimension)

{
  double dVar1;
  double *pdVar2;
  int dimension_00;
  undefined6 in_register_0000000a;
  long lVar3;
  bool bVar4;
  double grid_min_;
  double grid_max_;
  allocator<char> local_79;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> p;
  string local_58 [32];
  _Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_38;
  
  (this->values_of_landscapes).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->values_of_landscapes).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->values_of_landscapes).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p.super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  p.super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p.super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dimension_00 = (int)CONCAT62(in_register_0000000a,dimension);
  if (dimension_00 == 0xffff) {
    std::__cxx11::string::string<std::allocator<char>>(local_58,filename,&local_79);
    read_persistence_intervals_in_one_dimension_from_file
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               &local_38,(Persistence_representations *)local_58,(string *)0xffffffffffffffff,
               dimension_00,-1.0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>(local_58,filename,&local_79);
    read_persistence_intervals_in_one_dimension_from_file
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               &local_38,(Persistence_representations *)local_58,
               (string *)(CONCAT62(in_register_0000000a,dimension) & 0xffffffff),dimension_00,-1.0);
  }
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  _M_move_assign(&p,&local_38);
  std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Vector_base(&local_38);
  std::__cxx11::string::~string(local_58);
  lVar3 = (long)p.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)p.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  pdVar2 = &(p.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->second;
  grid_max_ = -1.79769313486232e+308;
  grid_min_ = 1.79769313486232e+308;
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    dVar1 = ((pair<double,_double> *)(pdVar2 + -1))->first;
    if (grid_min_ <= ((pair<double,_double> *)(pdVar2 + -1))->first) {
      dVar1 = grid_min_;
    }
    grid_min_ = dVar1;
    dVar1 = *pdVar2;
    if (*pdVar2 <= grid_max_) {
      dVar1 = grid_max_;
    }
    grid_max_ = dVar1;
    pdVar2 = pdVar2 + 2;
  }
  set_up_values_of_landscapes(this,&p,grid_min_,grid_max_,number_of_points_,0xffffffff);
  std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Vector_base(&p.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               );
  return;
}

Assistant:

Persistence_landscape_on_grid::Persistence_landscape_on_grid(const char* filename, size_t number_of_points_,
                                                             uint16_t dimension) {
  std::vector<std::pair<double, double> > p;
  if (dimension == std::numeric_limits<uint16_t>::max()) {
    p = read_persistence_intervals_in_one_dimension_from_file(filename);
  } else {
    p = read_persistence_intervals_in_one_dimension_from_file(filename, dimension);
  }
  double grid_min_ = std::numeric_limits<double>::max();
  double grid_max_ = -std::numeric_limits<double>::max();
  for (size_t i = 0; i != p.size(); ++i) {
    if (p[i].first < grid_min_) grid_min_ = p[i].first;
    if (p[i].second > grid_max_) grid_max_ = p[i].second;
  }
  this->set_up_values_of_landscapes(p, grid_min_, grid_max_, number_of_points_);
}